

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zetMetricGroupAddMetricExp
          (zet_metric_group_handle_t hMetricGroup,zet_metric_handle_t hMetric,
          size_t *pErrorStringSize,char *pErrorString)

{
  Logger *this;
  long *plVar1;
  ze_result_t result;
  ze_result_t zVar2;
  size_t i;
  long lVar3;
  long lVar4;
  long lVar5;
  allocator local_61;
  char *local_60;
  code *local_58;
  string local_50;
  
  lVar4 = context;
  this = *(Logger **)(context + 0xd50);
  local_60 = pErrorString;
  std::__cxx11::string::string
            ((string *)&local_50,
             "zetMetricGroupAddMetricExp(hMetricGroup, hMetric, pErrorStringSize, pErrorString)",
             &local_61);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar4 + 0x798) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar5 = *(long *)(lVar4 + 0xd38) - *(long *)(lVar4 + 0xd30) >> 3;
    lVar3 = 0;
    local_58 = *(code **)(lVar4 + 0x798);
    do {
      if (lVar5 == lVar3) {
        if ((*(char *)(context + 4) != '\x01') ||
           (result = ZETHandleLifetimeValidation::zetMetricGroupAddMetricExpPrologue
                               ((ZETHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 0x10),
                                hMetricGroup,hMetric,pErrorStringSize,local_60),
           result == ZE_RESULT_SUCCESS)) {
          zVar2 = (*local_58)(hMetricGroup,hMetric,pErrorStringSize,local_60);
          lVar4 = 0;
          goto LAB_00165ee6;
        }
        break;
      }
      plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar3 * 8) + 0x10);
      result = (**(code **)(*plVar1 + 0x400))(plVar1,hMetricGroup,hMetric,pErrorStringSize,local_60)
      ;
      lVar3 = lVar3 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_00165f24;
  while( true ) {
    plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar4 * 8) + 0x10);
    result = (**(code **)(*plVar1 + 0x408))
                       (plVar1,hMetricGroup,hMetric,pErrorStringSize,local_60,zVar2);
    lVar4 = lVar4 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_00165ee6:
    result = zVar2;
    if (lVar5 == lVar4) break;
  }
LAB_00165f24:
  logAndPropagateResult("zetMetricGroupAddMetricExp",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupAddMetricExp(
        zet_metric_group_handle_t hMetricGroup,         ///< [in] Handle of the metric group
        zet_metric_handle_t hMetric,                    ///< [in] Metric to be added to the group.
        size_t * pErrorStringSize,                      ///< [in,out][optional] Size of the error string to query, if an error was
                                                        ///< reported during adding the metric handle.
                                                        ///< if *pErrorStringSize is zero, then the driver shall update the value
                                                        ///< with the size of the error string in bytes.
        char* pErrorString                              ///< [in,out][optional][range(0, *pErrorStringSize)] Error string.
                                                        ///< if *pErrorStringSize is less than the length of the error string
                                                        ///< available, then driver shall only retrieve that length of error string.
        )
    {
        context.logger->log_trace("zetMetricGroupAddMetricExp(hMetricGroup, hMetric, pErrorStringSize, pErrorString)");

        auto pfnAddMetricExp = context.zetDdiTable.MetricGroupExp.pfnAddMetricExp;

        if( nullptr == pfnAddMetricExp )
            return logAndPropagateResult("zetMetricGroupAddMetricExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetMetricGroupAddMetricExpPrologue( hMetricGroup, hMetric, pErrorStringSize, pErrorString );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricGroupAddMetricExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zetHandleLifetime.zetMetricGroupAddMetricExpPrologue( hMetricGroup, hMetric, pErrorStringSize, pErrorString );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricGroupAddMetricExp", result);
        }

        auto driver_result = pfnAddMetricExp( hMetricGroup, hMetric, pErrorStringSize, pErrorString );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetMetricGroupAddMetricExpEpilogue( hMetricGroup, hMetric, pErrorStringSize, pErrorString ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetMetricGroupAddMetricExp", result);
        }

        return logAndPropagateResult("zetMetricGroupAddMetricExp", driver_result);
    }